

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

PropertyId __thiscall
Js::FunctionBody::GetReferencedPropertyIdWithMapIndexWithLock(FunctionBody *this,uint mapIndex)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  undefined4 *puVar5;
  
  piVar4 = FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)17,int*>
                     ((FunctionProxy *)this);
  if (piVar4 == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10f3,"(this->GetReferencedPropertyIdMapWithLock())",
                                "this->GetReferencedPropertyIdMapWithLock()");
    if (!bVar2) goto LAB_006cfc13;
    *puVar5 = 0;
  }
  uVar3 = GetReferencedPropertyIdCount(this);
  if (uVar3 <= mapIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10f4,"(mapIndex < this->GetReferencedPropertyIdCount())",
                                "mapIndex < this->GetReferencedPropertyIdCount()");
    if (!bVar2) {
LAB_006cfc13:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  piVar4 = FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)17,int*>
                     ((FunctionProxy *)this);
  return piVar4[mapIndex];
}

Assistant:

PropertyId FunctionBody::GetReferencedPropertyIdWithMapIndexWithLock(uint mapIndex)
    {
        Assert(this->GetReferencedPropertyIdMapWithLock());
        Assert(mapIndex < this->GetReferencedPropertyIdCount());
        return this->GetReferencedPropertyIdMapWithLock()[mapIndex];
    }